

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS3DLoader.cpp
# Opt level: O0

void __thiscall
Assimp::MS3DImporter::CollectChildJoints
          (MS3DImporter *this,
          vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
          *joints,vector<bool,_std::allocator<bool>_> *hadit,aiNode *nd,aiMatrix4x4 *absTrafo)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  ulong uVar5;
  void *pvVar6;
  aiNode *this_00;
  aiMatrix4x4t<float> *paVar7;
  aiMatrix4x4t<float> *m;
  bool bVar8;
  reference local_258;
  aiMatrix4x4t<float> local_248;
  aiBone *local_208;
  aiBone *bone;
  aiMesh *paStack_1f8;
  uint n;
  aiMesh *msh;
  undefined1 local_1e8 [4];
  uint a;
  aiMatrix4x4 abs;
  aiMatrix4x4t<float> local_168;
  aiMatrix4x4t<float> local_128;
  aiMatrix4x4t<float> local_e8;
  undefined1 local_a5;
  allocator<char> local_91;
  string local_90;
  aiNode *local_70;
  aiNode *ch;
  ulong local_58;
  size_t i_1;
  ulong local_40;
  size_t i;
  aiMatrix4x4 *paStack_30;
  uint cnt;
  aiMatrix4x4 *absTrafo_local;
  aiNode *nd_local;
  vector<bool,_std::allocator<bool>_> *hadit_local;
  vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
  *joints_local;
  MS3DImporter *this_local;
  
  i._4_4_ = 0.0;
  paStack_30 = absTrafo;
  absTrafo_local = (aiMatrix4x4 *)nd;
  nd_local = (aiNode *)hadit;
  hadit_local = (vector<bool,_std::allocator<bool>_> *)joints;
  joints_local = (vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                  *)this;
  for (local_40 = 0; uVar5 = local_40,
      sVar3 = std::
              vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
              ::size((vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                      *)hadit_local), uVar5 < sVar3; local_40 = local_40 + 1) {
    _i_1 = std::vector<bool,_std::allocator<bool>_>::operator[]
                     ((vector<bool,_std::allocator<bool>_> *)nd_local,local_40);
    bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&i_1);
    bVar8 = false;
    if (!bVar1) {
      pvVar4 = std::
               vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
               ::operator[]((vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                             *)hadit_local,local_40);
      iVar2 = strcmp(pvVar4->parentName,(char *)&absTrafo_local->a2);
      bVar8 = iVar2 == 0;
    }
    if (bVar8) {
      i._4_4_ = (float)((int)i._4_4_ + 1);
    }
  }
  absTrafo_local[0x11].b1 = i._4_4_;
  uVar5 = SUB168(ZEXT416((uint)i._4_4_) * ZEXT816(8),0);
  if (SUB168(ZEXT416((uint)i._4_4_) * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar5);
  *(void **)&absTrafo_local[0x11].b3 = pvVar6;
  i._4_4_ = 0.0;
  for (local_58 = 0; uVar5 = local_58,
      sVar3 = std::
              vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
              ::size((vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                      *)hadit_local), uVar5 < sVar3; local_58 = local_58 + 1) {
    _ch = std::vector<bool,_std::allocator<bool>_>::operator[]
                    ((vector<bool,_std::allocator<bool>_> *)nd_local,local_58);
    bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&ch);
    bVar8 = false;
    if (!bVar1) {
      pvVar4 = std::
               vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
               ::operator[]((vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                             *)hadit_local,local_58);
      iVar2 = strcmp(pvVar4->parentName,(char *)&absTrafo_local->a2);
      bVar8 = iVar2 == 0;
    }
    if (bVar8) {
      this_00 = (aiNode *)operator_new(0x478);
      local_a5 = 1;
      pvVar4 = std::
               vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
               ::operator[]((vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                             *)hadit_local,local_58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,pvVar4->name,&local_91)
      ;
      aiNode::aiNode(this_00,&local_90);
      local_a5 = 0;
      *(aiNode **)(*(long *)&absTrafo_local[0x11].b3 + (ulong)(uint)i._4_4_ * 8) = this_00;
      i._4_4_ = (float)((int)i._4_4_ + 1);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator(&local_91);
      this_00->mParent = (aiNode *)absTrafo_local;
      local_70 = this_00;
      pvVar4 = std::
               vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
               ::operator[]((vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                             *)hadit_local,local_58);
      aiMatrix4x4t<float>::aiMatrix4x4t(&local_128);
      aiMatrix4x4t<float>::aiMatrix4x4t(&local_168);
      memcpy(&local_168,&local_128,0x40);
      paVar7 = aiMatrix4x4t<float>::Translation(&pvVar4->position,&local_168);
      aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&abs.d3);
      pvVar4 = std::
               vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
               ::operator[]((vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                             *)hadit_local,local_58);
      m = aiMatrix4x4t<float>::FromEulerAnglesXYZ((aiMatrix4x4t<float> *)&abs.d3,&pvVar4->rotation);
      aiMatrix4x4t<float>::operator*(&local_e8,paVar7,m);
      memcpy(&local_70->mTransformation,&local_e8,0x40);
      aiMatrix4x4t<float>::operator*
                ((aiMatrix4x4t<float> *)local_1e8,paStack_30,&local_70->mTransformation);
      for (msh._4_4_ = 0; msh._4_4_ < this->mScene->mNumMeshes; msh._4_4_ = msh._4_4_ + 1) {
        paStack_1f8 = this->mScene->mMeshes[msh._4_4_];
        for (bone._4_4_ = 0; bone._4_4_ < paStack_1f8->mNumBones; bone._4_4_ = bone._4_4_ + 1) {
          local_208 = paStack_1f8->mBones[bone._4_4_];
          bVar8 = aiString::operator==(&local_208->mName,&local_70->mName);
          if (bVar8) {
            memcpy(&local_248,local_1e8,0x40);
            paVar7 = aiMatrix4x4t<float>::Inverse(&local_248);
            memcpy(&local_208->mOffsetMatrix,paVar7,0x40);
          }
        }
      }
      local_258 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)nd_local,local_58);
      std::_Bit_reference::operator=(&local_258,true);
      CollectChildJoints(this,(vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                               *)hadit_local,(vector<bool,_std::allocator<bool>_> *)nd_local,
                         local_70,(aiMatrix4x4 *)local_1e8);
    }
  }
  return;
}

Assistant:

void MS3DImporter :: CollectChildJoints(const std::vector<TempJoint>& joints,
    std::vector<bool>& hadit,
    aiNode* nd,
    const aiMatrix4x4& absTrafo)
{
    unsigned int cnt = 0;
    for(size_t i = 0; i < joints.size(); ++i) {
        if (!hadit[i] && !strcmp(joints[i].parentName,nd->mName.data)) {
            ++cnt;
        }
    }

    nd->mChildren = new aiNode*[nd->mNumChildren = cnt];
    cnt = 0;
    for(size_t i = 0; i < joints.size(); ++i) {
        if (!hadit[i] && !strcmp(joints[i].parentName,nd->mName.data)) {
            aiNode* ch = nd->mChildren[cnt++] = new aiNode(joints[i].name);
            ch->mParent = nd;

            ch->mTransformation = aiMatrix4x4::Translation(joints[i].position,aiMatrix4x4()=aiMatrix4x4())*
                aiMatrix4x4().FromEulerAnglesXYZ(joints[i].rotation);

            const aiMatrix4x4 abs = absTrafo*ch->mTransformation;
            for(unsigned int a = 0; a < mScene->mNumMeshes; ++a) {
                aiMesh* const msh = mScene->mMeshes[a];
                for(unsigned int n = 0; n < msh->mNumBones; ++n) {
                    aiBone* const bone = msh->mBones[n];

                    if(bone->mName == ch->mName) {
                        bone->mOffsetMatrix = aiMatrix4x4(abs).Inverse();
                    }
                }
            }

            hadit[i] = true;
            CollectChildJoints(joints,hadit,ch,abs);
        }
    }
}